

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O0

void spdlog::set_pattern(string *pattern,pattern_time_type time_type)

{
  string *in_RDI;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar1;
  undefined4 in_stack_ffffffffffffff94;
  allocator<char> *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  pattern_time_type in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  pattern_formatter *in_stack_ffffffffffffffc0;
  string local_38 [32];
  formatter local_18 [3];
  
  operator_new(0xa8);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
  std::__cxx11::string::string(local_38,in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  pattern_formatter::pattern_formatter
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
             in_stack_ffffffffffffffa8);
  uVar1 = uVar1 & 0xffffff;
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<std::default_delete<spdlog::formatter>,void>
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)in_RDI,
             local_18);
  set_formatter((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                CONCAT44(in_stack_ffffffffffffff94,uVar1));
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

SPDLOG_INLINE void set_pattern(std::string pattern, pattern_time_type time_type)
{
    set_formatter(std::unique_ptr<spdlog::formatter>(new pattern_formatter(std::move(pattern), time_type)));
}